

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islamcal.cpp
# Opt level: O3

int32_t __thiscall
icu_63::IslamicCalendar::monthStart(IslamicCalendar *this,int32_t year,int32_t month)

{
  int32_t iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  double dVar5;
  
  iVar2 = *(int *)&(this->super_Calendar).field_0x264;
  if (iVar2 != 0) {
    if ((iVar2 == 3) || (iVar2 == 1)) {
      dVar5 = uprv_ceil_63((double)month * 29.5);
      iVar1 = ClockMath::floorDivide(year * 0xb + 3,0x1e);
      iVar1 = iVar1 + year * 0x162 + (int)dVar5 + -0x162;
    }
    else {
      iVar1 = yearStart(this,year);
      if (0 < month) {
        uVar4 = 0;
        do {
          iVar2 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x22])(this,year,uVar4);
          iVar1 = iVar1 + iVar2;
          uVar3 = (int)uVar4 + 1;
          uVar4 = (ulong)uVar3;
        } while (month != uVar3);
      }
    }
    return iVar1;
  }
  iVar1 = trueMonthStart(this,month + year * 0xc + -0xc);
  return iVar1;
}

Assistant:

int32_t IslamicCalendar::monthStart(int32_t year, int32_t month) const {
    if (cType == CIVIL || cType == TBLA) {
        // This does not handle months out of the range 0..11
        return (int32_t)uprv_ceil(29.5*month)
            + (year-1)*354 + (int32_t)ClockMath::floorDivide((3+11*year),30);
    } else if(cType==ASTRONOMICAL){
        return trueMonthStart(12*(year-1) + month);
    } else {
        int32_t ms = yearStart(year);
        for(int i=0; i< month; i++){
            ms+= handleGetMonthLength(year, i);
        }
        return ms;
    }
}